

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void init::LogPackageVersion(void)

{
  long lVar1;
  long in_FS_OFFSET;
  ConstevalFormatString<1U> in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  undefined1 in_stack_00000040 [16];
  string version_string;
  Level in_stack_00000120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000130;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *this;
  char *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8;
  FormatFullVersion_abi_cxx11_();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,in_stack_ffffffffffffff90);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,in_stack_ffffffffffffff90);
  uVar2 = 2;
  LogPrintFormatInternal<std::__cxx11::string>
            ((string_view)in_stack_00000040,(string_view)in_stack_00000030,in_stack_ffffffffffffffec
             ,(LogFlags)in_stack_ffffffffffffffe0,in_stack_00000120,in_stack_00000028,
             in_stack_00000130);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,uVar2));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LogPackageVersion()
{
    std::string version_string = FormatFullVersion();
#ifdef DEBUG
    version_string += " (debug build)";
#else
    version_string += " (release build)";
#endif
    LogPrintf(PACKAGE_NAME " version %s\n", version_string);
}